

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3RunParser(Parse *pParse,char *zSql,char **pzErrMsg)

{
  uchar *puVar1;
  Table *pTable;
  bool bVar2;
  Parse *pPVar3;
  uint uVar4;
  unsigned_short uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  YYMINORTYPE *yypminor;
  char *pcVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  AutoincInfo *p;
  byte bVar13;
  ulong uVar15;
  uint uVar16;
  sqlite3 *db;
  uint uVar17;
  yyParser sEngine;
  uint local_d08;
  int local_d04;
  sqlite3 *local_d00;
  char **local_cf8;
  uchar *local_cf0;
  uint local_ce8;
  YYMINORTYPE local_ce0;
  yyParser local_cc8;
  ulong uVar14;
  
  db = pParse->db;
  iVar6 = db->aLimit[1];
  if (db->nVdbeActive == 0) {
    (db->u1).isInterrupted = 0;
  }
  pParse->rc = 0;
  pParse->zTail = zSql;
  local_cc8.yytos = local_cc8.yystack;
  local_cc8.yystack[0].stateno = 0;
  local_cc8.yystack[0].major = '\0';
  local_cc8.yystackEnd = local_cc8.yystack + 99;
  uVar11 = 0;
  uVar17 = 0xffffffff;
  local_cf8 = pzErrMsg;
LAB_0011ed2a:
  do {
    if (*zSql == '\0') {
      uVar4 = 0;
      if (uVar17 != 1) {
        if (uVar17 == 0) goto LAB_0011efb3;
        uVar4 = 1;
      }
      zSql = (char *)((uchar *)zSql + -(long)(int)uVar11);
      local_d08 = uVar4;
    }
    else {
      uVar4 = sqlite3GetToken((uchar *)zSql,(int *)&local_d08);
      iVar6 = iVar6 - uVar4;
      if (iVar6 < 0) {
        pParse->rc = 0x12;
LAB_0011efb3:
        pParse->zTail = zSql;
        if (local_cc8.yystack < local_cc8.yytos) {
          do {
            puVar1 = &(local_cc8.yytos)->major;
            yypminor = &(local_cc8.yytos)->minor;
            local_cc8.yytos = local_cc8.yytos + -1;
            yy_destructor(&local_cc8,*puVar1,yypminor);
          } while (local_cc8.yystack < local_cc8.yytos);
        }
        if (db->mallocFailed != '\0') {
          pParse->rc = 7;
        }
        uVar17 = pParse->rc;
        if (((uVar17 != 0) && (uVar17 != 0x65)) && (pParse->zErrMsg == (char *)0x0)) {
          if (uVar17 == 0x204) {
            pcVar9 = "abort due to ROLLBACK";
          }
          else {
            pcVar9 = "unknown error";
            if (((uVar17 & 0xff) < 0x1b) && ((0x1410004UL >> ((ulong)(byte)uVar17 & 0x3f) & 1) == 0)
               ) {
              pcVar9 = *(char **)(sqlite3ErrStr_aMsg + (ulong)(byte)uVar17 * 8);
            }
          }
          pcVar9 = sqlite3MPrintf(db,"%s",pcVar9);
          pParse->zErrMsg = pcVar9;
        }
        pcVar9 = pParse->zErrMsg;
        if (pcVar9 != (char *)0x0) {
          *local_cf8 = pcVar9;
          sqlite3_log(pParse->rc,"%s");
          pParse->zErrMsg = (char *)0x0;
        }
        if (((pParse->pVdbe != (Vdbe *)0x0) && (0 < pParse->nErr)) && (pParse->nested == '\0')) {
          sqlite3VdbeDelete(pParse->pVdbe);
          pParse->pVdbe = (Vdbe *)0x0;
        }
        if (pParse->nested == '\0') {
          if (pParse->aTableLock != (TableLock *)0x0) {
            sqlite3DbFreeNN(db,pParse->aTableLock);
          }
          pParse->aTableLock = (TableLock *)0x0;
          pParse->nTableLock = 0;
        }
        sqlite3_free(pParse->apVtabLock);
        if (pParse->declareVtab == '\0') {
          sqlite3DeleteTable(db,pParse->pNewTable);
        }
        if (pParse->pWithToFree != (With *)0x0) {
          sqlite3WithDelete(db,pParse->pWithToFree);
        }
        sqlite3DeleteTrigger(db,pParse->pNewTrigger);
        p = (AutoincInfo *)pParse->pVList;
        if (p != (AutoincInfo *)0x0) goto LAB_0011f140;
        while (p = pParse->pAinc, p != (AutoincInfo *)0x0) {
          pParse->pAinc = p->pNext;
LAB_0011f140:
          sqlite3DbFreeNN(db,p);
        }
        while (pTable = pParse->pZombieTab, pTable != (Table *)0x0) {
          pParse->pZombieTab = pTable->pNextZombie;
          sqlite3DeleteTable(db,pTable);
        }
        return (uint)(pcVar9 != (char *)0x0);
      }
      uVar11 = (ulong)uVar4;
    }
    uVar4 = local_d08;
    uVar10 = (uint)uVar11;
    if (0xa2 < (int)local_d08) {
      if ((db->u1).isInterrupted != 0) {
        pParse->rc = 9;
        goto LAB_0011efb3;
      }
      if (local_d08 == 0xa4) {
        sqlite3ErrorMsg(pParse,"unrecognized token: \"%.*s\"",uVar11,zSql);
        goto LAB_0011efb3;
      }
      zSql = (char *)((uchar *)zSql + (int)uVar10);
      goto LAB_0011ed2a;
    }
    (pParse->sLastToken).z = zSql;
    (pParse->sLastToken).n = uVar10;
    uVar17 = local_d08;
    local_d04 = iVar6;
    local_d00 = db;
    local_cc8.pParse = pParse;
    do {
      pPVar3 = local_cc8.pParse;
      uVar8 = (ulong)(local_cc8.yytos)->stateno;
      uVar7 = (uint)(local_cc8.yytos)->stateno;
      uVar12 = uVar7;
      if (uVar8 < 0x3e1) {
        iVar6 = (int)yy_shift_ofst[uVar8];
        uVar14 = (ulong)uVar17;
        do {
          bVar13 = (byte)uVar14;
          uVar16 = (int)(uVar14 & 0xff) + iVar6;
          if ((uVar16 < 0x61d) && (yy_lookahead[uVar16] == bVar13)) {
            uVar12 = (uint)yy_action[uVar16];
            break;
          }
          if (bVar13 < 0x45) {
            uVar15 = (ulong)""[uVar14 & 0xff];
            bVar2 = true;
            if (""[uVar14 & 0xff] == 0) goto LAB_0011ee20;
          }
          else {
LAB_0011ee20:
            bVar2 = true;
            if ((((iVar6 < 0x5d8) && (uVar8 != 0x68)) && (uVar7 != 0xe0)) &&
               ((bVar13 != 0 && (yy_lookahead[iVar6 + 0x45U] == 'E')))) {
              uVar12 = (uint)yy_action[iVar6 + 0x45U];
              bVar2 = false;
            }
            if (bVar2) {
              uVar12 = (uint)yy_default[uVar8];
            }
            bVar2 = false;
            uVar15 = uVar14;
          }
          uVar14 = uVar15;
        } while (bVar2);
      }
      if (uVar12 < 0x3e1) {
        if (local_cc8.yystackEnd < local_cc8.yytos + 1) {
          yyStackOverflow(&local_cc8);
        }
        else {
          uVar5 = (unsigned_short)uVar12 + 0x149;
          if (uVar12 < 0x1c7) {
            uVar5 = (unsigned_short)uVar12;
          }
          local_cc8.yytos[1].stateno = uVar5;
          local_cc8.yytos[1].major = (uchar)uVar17;
          local_cc8.yytos[1].minor.yy0.z = zSql;
          local_cc8.yytos[1].minor.yy0.n = uVar10;
          local_cc8.yytos = local_cc8.yytos + 1;
        }
        uVar17 = 0xfc;
      }
      else if (uVar12 < 0x52a) {
        yy_reduce(&local_cc8,uVar12 - 0x3e1);
      }
      else {
        local_cf0 = (uchar *)zSql;
        local_ce8 = uVar10;
        local_ce0.yy0.z = zSql;
        local_ce0.yy0.n = uVar10;
        sqlite3ErrorMsg(local_cc8.pParse,"near \"%T\": syntax error",&local_cf0);
        local_cc8.pParse = pPVar3;
        yy_destructor(&local_cc8,(uchar)uVar17,&local_ce0);
        uVar17 = 0xfc;
      }
    } while ((uVar17 != 0xfc) && (local_cc8.yystack < local_cc8.yytos));
    zSql = (char *)((uchar *)zSql + (int)uVar10);
    db = local_d00;
    if ((pParse->rc != 0) || (iVar6 = local_d04, uVar17 = uVar4, local_d00->mallocFailed != '\0'))
    goto LAB_0011efb3;
  } while( true );
}

Assistant:

SQLITE_PRIVATE int sqlite3RunParser(Parse *pParse, const char *zSql, char **pzErrMsg){
  int nErr = 0;                   /* Number of errors encountered */
  void *pEngine;                  /* The LEMON-generated LALR(1) parser */
  int n = 0;                      /* Length of the next token token */
  int tokenType;                  /* type of the next token */
  int lastTokenParsed = -1;       /* type of the previous token */
  sqlite3 *db = pParse->db;       /* The database connection */
  int mxSqlLen;                   /* Max length of an SQL string */
#ifdef sqlite3Parser_ENGINEALWAYSONSTACK
  yyParser sEngine;    /* Space to hold the Lemon-generated Parser object */
#endif

  assert( zSql!=0 );
  mxSqlLen = db->aLimit[SQLITE_LIMIT_SQL_LENGTH];
  if( db->nVdbeActive==0 ){
    db->u1.isInterrupted = 0;
  }
  pParse->rc = SQLITE_OK;
  pParse->zTail = zSql;
  assert( pzErrMsg!=0 );
  /* sqlite3ParserTrace(stdout, "parser: "); */
#ifdef sqlite3Parser_ENGINEALWAYSONSTACK
  pEngine = &sEngine;
  sqlite3ParserInit(pEngine);
#else
  pEngine = sqlite3ParserAlloc(sqlite3Malloc);
  if( pEngine==0 ){
    sqlite3OomFault(db);
    return SQLITE_NOMEM_BKPT;
  }
#endif
  assert( pParse->pNewTable==0 );
  assert( pParse->pNewTrigger==0 );
  assert( pParse->nVar==0 );
  assert( pParse->pVList==0 );
  while( 1 ){
    if( zSql[0]!=0 ){
      n = sqlite3GetToken((u8*)zSql, &tokenType);
      mxSqlLen -= n;
      if( mxSqlLen<0 ){
        pParse->rc = SQLITE_TOOBIG;
        break;
      }
    }else{
      /* Upon reaching the end of input, call the parser two more times
      ** with tokens TK_SEMI and 0, in that order. */
      if( lastTokenParsed==TK_SEMI ){
        tokenType = 0;
      }else if( lastTokenParsed==0 ){
        break;
      }else{
        tokenType = TK_SEMI;
      }
      zSql -= n;
    }
    if( tokenType>=TK_SPACE ){
      assert( tokenType==TK_SPACE || tokenType==TK_ILLEGAL );
      if( db->u1.isInterrupted ){
        pParse->rc = SQLITE_INTERRUPT;
        break;
      }
      if( tokenType==TK_ILLEGAL ){
        sqlite3ErrorMsg(pParse, "unrecognized token: \"%.*s\"", n, zSql);
        break;
      }
      zSql += n;
    }else{
      pParse->sLastToken.z = zSql;
      pParse->sLastToken.n = n;
      sqlite3Parser(pEngine, tokenType, pParse->sLastToken, pParse);
      lastTokenParsed = tokenType;
      zSql += n;
      if( pParse->rc!=SQLITE_OK || db->mallocFailed ) break;
    }
  }
  assert( nErr==0 );
  pParse->zTail = zSql;
#ifdef YYTRACKMAXSTACKDEPTH
  sqlite3_mutex_enter(sqlite3MallocMutex());
  sqlite3StatusHighwater(SQLITE_STATUS_PARSER_STACK,
      sqlite3ParserStackPeak(pEngine)
  );
  sqlite3_mutex_leave(sqlite3MallocMutex());
#endif /* YYDEBUG */
#ifdef sqlite3Parser_ENGINEALWAYSONSTACK
  sqlite3ParserFinalize(pEngine);
#else
  sqlite3ParserFree(pEngine, sqlite3_free);
#endif
  if( db->mallocFailed ){
    pParse->rc = SQLITE_NOMEM_BKPT;
  }
  if( pParse->rc!=SQLITE_OK && pParse->rc!=SQLITE_DONE && pParse->zErrMsg==0 ){
    pParse->zErrMsg = sqlite3MPrintf(db, "%s", sqlite3ErrStr(pParse->rc));
  }
  assert( pzErrMsg!=0 );
  if( pParse->zErrMsg ){
    *pzErrMsg = pParse->zErrMsg;
    sqlite3_log(pParse->rc, "%s", *pzErrMsg);
    pParse->zErrMsg = 0;
    nErr++;
  }
  if( pParse->pVdbe && pParse->nErr>0 && pParse->nested==0 ){
    sqlite3VdbeDelete(pParse->pVdbe);
    pParse->pVdbe = 0;
  }
#ifndef SQLITE_OMIT_SHARED_CACHE
  if( pParse->nested==0 ){
    sqlite3DbFree(db, pParse->aTableLock);
    pParse->aTableLock = 0;
    pParse->nTableLock = 0;
  }
#endif
#ifndef SQLITE_OMIT_VIRTUALTABLE
  sqlite3_free(pParse->apVtabLock);
#endif

  if( !IN_DECLARE_VTAB ){
    /* If the pParse->declareVtab flag is set, do not delete any table 
    ** structure built up in pParse->pNewTable. The calling code (see vtab.c)
    ** will take responsibility for freeing the Table structure.
    */
    sqlite3DeleteTable(db, pParse->pNewTable);
  }

  if( pParse->pWithToFree ) sqlite3WithDelete(db, pParse->pWithToFree);
  sqlite3DeleteTrigger(db, pParse->pNewTrigger);
  sqlite3DbFree(db, pParse->pVList);
  while( pParse->pAinc ){
    AutoincInfo *p = pParse->pAinc;
    pParse->pAinc = p->pNext;
    sqlite3DbFreeNN(db, p);
  }
  while( pParse->pZombieTab ){
    Table *p = pParse->pZombieTab;
    pParse->pZombieTab = p->pNextZombie;
    sqlite3DeleteTable(db, p);
  }
  assert( nErr==0 || pParse->rc!=SQLITE_OK );
  return nErr;
}